

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  int __nfds;
  uchar uVar1;
  anon_union_4_2_27a871e9_for_ip_0 aVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined7 uVar8;
  unsigned_short id;
  uint16_t uVar9;
  uint __i;
  int iVar10;
  uint uVar11;
  long lVar12;
  ssize_t sVar13;
  time_t tVar14;
  size_t __n;
  int *piVar15;
  char *pcVar16;
  static_record_data *psVar17;
  record_data *prVar18;
  clock_t cVar19;
  short sVar20;
  IP *pIVar21;
  uint uVar22;
  ulong uVar23;
  undefined4 in_register_0000003c;
  cache *pcVar24;
  anon_struct_1056_4_b1f103b0 *paVar25;
  char *pcVar26;
  answer *paVar27;
  bool bVar28;
  socklen_t len;
  dns_header header;
  _sockaddr_in cliaddr;
  timeval timeout;
  question question;
  fd_set rset;
  record_data *send_data [20];
  record_data tmp_ans_data [10];
  answer ans [20];
  
  for (lVar12 = 0; lVar12 != 0x10; lVar12 = lVar12 + 1) {
    rset.__fds_bits[lVar12] = 0;
  }
  timeout.tv_usec = 800000;
  timeout.tv_sec = 0;
  init((EVP_PKEY_CTX *)CONCAT44(in_register_0000003c,argc));
  __nfds = query_sockfd + 1;
LAB_00104a7a:
  do {
    do {
      rset.__fds_bits[server_sockfd / 0x40] =
           rset.__fds_bits[server_sockfd / 0x40] | 1L << ((byte)server_sockfd & 0x3f);
      rset.__fds_bits[query_sockfd / 0x40] =
           rset.__fds_bits[query_sockfd / 0x40] | 1L << ((byte)query_sockfd & 0x3f);
      iVar10 = select(__nfds,(fd_set *)&rset,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&timeout);
      if (iVar10 < 0) {
        iVar10 = 0xc1;
        pcVar16 = anon_var_dwarf_4157;
        goto LAB_00104c83;
      }
      if (iVar10 == 0) {
        lVar12 = 0x400;
        pcVar16 = IDAdapter.data[0].message;
        while (bVar28 = lVar12 != 0, lVar12 = lVar12 + -1, bVar28) {
          if (((_Bool)pcVar16[-0xc] == true) &&
             (cVar19 = clock(), 999 < cVar19 - *(long *)(pcVar16 + -8))) {
            log_log(2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
                    ,0xca,anon_var_dwarf_416d);
            set_header_flag(pcVar16,0x8000);
            set_header_rcode_refused(pcVar16);
            iVar10 = server_sockfd;
            __n = strlen(pcVar16);
            sVar13 = sendto(iVar10,pcVar16,__n,0,(sockaddr *)(pcVar16 + -0x20),0x10);
            if (sVar13 < 0) {
              piVar15 = __errno_location();
              pcVar26 = strerror(*piVar15);
              log_log(4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
                      ,0xcf,"%s:%s","sendto error:",pcVar26);
              *piVar15 = 0;
            }
            else {
              log_log(2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
                      ,0xd1,anon_var_dwarf_41af);
            }
            pcVar16[-0xc] = false;
          }
          pcVar16 = pcVar16 + 0x420;
        }
      }
      if (((ulong)rset.__fds_bits[query_sockfd / 0x40] >> ((long)query_sockfd % 0x40 & 0x3fU) & 1)
          != 0) {
        log_log(2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
                ,0xdb,anon_var_dwarf_41b9);
        sVar13 = recvfrom(query_sockfd,recv_buffer,0x208,0,(sockaddr *)&query_server,&len);
        if ((int)(uint)sVar13 < 0) {
          piVar15 = __errno_location();
          pcVar16 = strerror(*piVar15);
          log_log(4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
                  ,0xe0,"%s:%s","recvfrom error:",pcVar16);
          *piVar15 = 0;
        }
        else {
          read_dns_header(&header,recv_buffer);
          sVar20 = (short)header.id % 0x400;
          if (IDAdapter.data[sVar20].valid == false) {
            log_log(4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
                    ,0xe5,"invalid id");
          }
          else {
            log_log(2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
                    ,0xe8,anon_var_dwarf_41fb,(ulong)header.id,
                    (ulong)IDAdapter.data[sVar20].info.old_id,(uint)IDAdapter.data[sVar20].info.type
                   );
            uVar1 = IDAdapter.data[sVar20].info.type;
            if (((uVar1 == '\x1c') || (uVar1 == '\x01')) &&
               (uVar11 = read_dns_answers(ans,recv_buffer), 0 < (int)uVar11)) {
              tVar14 = time((time_t *)0x0);
              read_dns_question(&question,recv_buffer + 0xc,recv_buffer);
              prVar18 = tmp_ans_data;
              pIVar21 = &ans[0].address;
              for (uVar23 = 0; uVar11 != uVar23; uVar23 = uVar23 + 1) {
                aVar2 = (pIVar21->addr).field_0;
                uVar3 = *(undefined4 *)((long)&pIVar21->addr + 4);
                uVar4 = *(undefined4 *)((long)&pIVar21->addr + 8);
                uVar5 = *(undefined4 *)((long)&pIVar21->addr + 0xc);
                uVar8 = *(undefined7 *)&pIVar21->field_0x11;
                uVar6 = *(undefined8 *)&pIVar21->field_0x18;
                (prVar18->ip).type = pIVar21->type;
                *(undefined7 *)&(prVar18->ip).field_0x11 = uVar8;
                *(undefined8 *)&(prVar18->ip).field_0x18 = uVar6;
                (prVar18->ip).addr.field_0 = aVar2;
                *(undefined4 *)((long)&(prVar18->ip).addr + 4) = uVar3;
                *(undefined4 *)((long)&(prVar18->ip).addr + 8) = uVar4;
                *(undefined4 *)((long)&(prVar18->ip).addr + 0xc) = uVar5;
                prVar18->label = question.label;
                prVar18->ttl = (ulong)*(uint32_t *)((long)(pIVar21 + 9) + 4) + tVar14;
                send_data[uVar23] = prVar18;
                pIVar21 = (IP *)((long)(pIVar21 + 0x11) + 0x10);
                prVar18 = prVar18 + 1;
              }
              log_log(1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
                      ,0xfc,"count:%d",(ulong)uVar11);
              uVar1 = IDAdapter.data[sVar20].info.type;
              pcVar24 = &cacheset.A.temp;
              if (uVar1 != '\x01') {
                if (uVar1 != '\x1c') goto LAB_00104e36;
                pcVar24 = &cacheset.AAAA.temp;
              }
              set_cache_A_multi_record(pcVar24,question.label,send_data,uVar11);
            }
LAB_00104e36:
            set_header_id(recv_buffer,IDAdapter.data[sVar20].info.old_id);
            sVar13 = sendto(server_sockfd,recv_buffer,(ulong)((uint)sVar13 & 0x7fffffff),0,
                            (sockaddr *)(IDAdapter.data + sVar20),0x10);
            if (sVar13 < 0) {
              piVar15 = __errno_location();
              pcVar16 = strerror(*piVar15);
              log_log(4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
                      ,0x109,"%s:%s","sendto error:",pcVar16);
              *piVar15 = 0;
            }
            log_ip(anon_var_dwarf_4227,&cliaddr);
            uVar9 = header.id;
            pthread_rwlock_rdlock((pthread_rwlock_t *)&IDAdapter.rwlock);
            IDAdapter.data[(short)uVar9 % 0x400].valid = false;
            pthread_rwlock_unlock((pthread_rwlock_t *)&IDAdapter.rwlock);
          }
        }
      }
    } while (((ulong)rset.__fds_bits[server_sockfd / 0x40] >> ((long)server_sockfd % 0x40 & 0x3fU) &
             1) == 0);
    len = 0x10;
    sVar13 = recvfrom(server_sockfd,recv_buffer,0x208,0,(sockaddr *)&cliaddr,&len);
    uVar11 = (uint)sVar13;
  } while ((int)uVar11 < 0);
  log_ip("recvfrom:",&cliaddr);
  read_dns_header(&header,recv_buffer);
  if (header.field_1.flags != 1) {
    set_header_flag(recv_buffer,0x8000);
    set_header_rcode_refused(recv_buffer);
    sVar13 = sendto(server_sockfd,recv_buffer,(ulong)(uVar11 & 0x7fffffff),0,(sockaddr *)&cliaddr,
                    0x10);
    if (sVar13 < 0) {
      piVar15 = __errno_location();
      pcVar16 = strerror(*piVar15);
      log_log(4,
              "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
              ,0x122,"%s:%s","sendto error:",pcVar16);
      *piVar15 = 0;
    }
    else {
      log_log(2,
              "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
              ,0x124,anon_var_dwarf_428c + 0x21);
    }
  }
  read_dns_questions(&question,recv_buffer);
  pcVar16 = RRtype_to_str(question._256_4_ & 0xffff);
  log_log(2,"/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c",
          0x128,"%s %s",pcVar16,&question);
  psVar17 = get_static_cache(&cacheset.blacklist,question.label);
  if (psVar17 != (static_record_data *)0x0) {
    log_log(2,"/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
            ,300,anon_var_dwarf_426b);
    set_header_flag(recv_buffer,0x8000);
    set_header_rcode_name_error(recv_buffer);
    sVar13 = sendto(server_sockfd,recv_buffer,(ulong)(uVar11 & 0x7fffffff),0,(sockaddr *)&cliaddr,
                    0x10);
    if (-1 < sVar13) {
      iVar10 = 0x133;
      pcVar16 = anon_var_dwarf_41af;
LAB_00104c83:
      log_log(2,
              "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
              ,iVar10,pcVar16);
      goto LAB_00104a7a;
    }
    piVar15 = __errno_location();
    pcVar16 = strerror(*piVar15);
    iVar10 = 0x131;
    pcVar26 = "sendto error:";
    goto LAB_0010511a;
  }
  if ((question._256_4_ & 0xffff) == 0x1c) {
    psVar17 = get_static_cache(&cacheset.AAAA.local,question.label);
    pcVar24 = &cacheset.AAAA.temp;
LAB_00105147:
    uVar3 = question._256_4_;
    if (psVar17 == (static_record_data *)0x0) {
      prVar18 = get_cache_A_record(pcVar24,question.label);
      if (prVar18 == (record_data *)0x0) goto LAB_00105309;
      tVar14 = time((time_t *)0x0);
      uVar3 = question._256_4_;
      paVar27 = ans;
      uVar22 = 0;
      for (; prVar18 != (record_data *)0x0; prVar18 = prVar18->next) {
        paVar27->ttl = (int)prVar18->ttl - (int)tVar14;
        uVar6 = *(undefined8 *)((long)&(prVar18->ip).addr + 8);
        uVar1 = (prVar18->ip).type;
        uVar8 = *(undefined7 *)&(prVar18->ip).field_0x11;
        uVar7 = *(undefined8 *)&(prVar18->ip).field_0x18;
        *(undefined8 *)&(paVar27->address).addr = *(undefined8 *)&(prVar18->ip).addr;
        *(undefined8 *)((long)&(paVar27->address).addr + 8) = uVar6;
        (paVar27->address).type = uVar1;
        *(undefined7 *)&(paVar27->address).field_0x11 = uVar8;
        *(undefined8 *)&(paVar27->address).field_0x18 = uVar7;
        strcpy(paVar27->name,question.label);
        uVar4 = question._256_4_;
        question.qtype = (uint16_t)uVar3;
        question.qclass = SUB42(uVar3,2);
        paVar27->type = question.qtype;
        paVar27->class_ = question.qclass;
        paVar27->has_cname = false;
        question._256_4_ = uVar4;
        strcpy(paVar27->name,question.label);
        uVar22 = uVar22 + 1;
        paVar27 = paVar27 + 1;
      }
    }
    else {
      paVar27 = ans;
      uVar22 = 0;
      for (; uVar4 = question._256_4_, psVar17 != (static_record_data *)0x0; psVar17 = psVar17->next
          ) {
        paVar27->ttl = 0xe10;
        uVar6 = *(undefined8 *)((long)&(psVar17->ip).addr + 8);
        uVar1 = (psVar17->ip).type;
        uVar8 = *(undefined7 *)&(psVar17->ip).field_0x11;
        uVar7 = *(undefined8 *)&(psVar17->ip).field_0x18;
        *(undefined8 *)&(paVar27->address).addr = *(undefined8 *)&(psVar17->ip).addr;
        *(undefined8 *)((long)&(paVar27->address).addr + 8) = uVar6;
        (paVar27->address).type = uVar1;
        *(undefined7 *)&(paVar27->address).field_0x11 = uVar8;
        *(undefined8 *)&(paVar27->address).field_0x18 = uVar7;
        question.qtype = (uint16_t)uVar3;
        question.qclass = SUB42(uVar3,2);
        paVar27->type = question.qtype;
        paVar27->class_ = question.qclass;
        paVar27->has_cname = false;
        question._256_4_ = uVar4;
        strcpy(paVar27->name,question.label);
        uVar22 = uVar22 + 1;
        paVar27 = paVar27 + 1;
      }
    }
    if (uVar22 != 0) {
      log_log(2,
              "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
              ,0x161,anon_var_dwarf_42a3 + 3);
      uVar11 = write_dns_response_by_query(recv_buffer,ans,(uint16_t)uVar22);
      sVar13 = sendto(server_sockfd,recv_buffer,(long)(int)uVar11,0,(sockaddr *)&cliaddr,0x10);
      if (-1 < sVar13) {
        log_log(2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
                ,0x16a,anon_var_dwarf_428c,(ulong)uVar11,(ulong)uVar22);
        goto LAB_00104a7a;
      }
      piVar15 = __errno_location();
      pcVar16 = strerror(*piVar15);
      iVar10 = 0x168;
      pcVar26 = "send error";
      goto LAB_0010511a;
    }
  }
  else if ((question._256_4_ & 0xffff) == 1) {
    psVar17 = get_static_cache(&cacheset.A.local,question.label);
    pcVar24 = &cacheset.A.temp;
    goto LAB_00105147;
  }
LAB_00105309:
  log_log(2,"/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c",
          0x16e,anon_var_dwarf_42a3);
  uVar3 = question._256_4_;
  uVar9 = header.id;
  recv_buffer[uVar11 & 0x7fffffff] = '\0';
  cVar19 = clock();
  pthread_rwlock_wrlock((pthread_rwlock_t *)&IDAdapter.rwlock);
  id = IDAdapter.next;
  uVar23 = (ulong)(short)IDAdapter.next;
  if (IDAdapter.data[uVar23].valid != false) goto LAB_00104a7a;
  paVar25 = IDAdapter.data + uVar23;
  IDAdapter.data[uVar23].valid = true;
  (paVar25->info).addr.sin_family = cliaddr.sin_family;
  (paVar25->info).addr.sin_port = cliaddr.sin_port;
  (paVar25->info).addr.sin_addr = (in_addr)cliaddr.sin_addr.s_addr;
  *&IDAdapter.data[uVar23].info.addr.sin_zero = cliaddr.sin_zero;
  IDAdapter.data[uVar23].info.old_id = uVar9;
  IDAdapter.data[uVar23].info.type = (uchar)uVar3;
  IDAdapter.data[uVar23].start = cVar19;
  strcpy(IDAdapter.data[uVar23].message,recv_buffer);
  IDAdapter.next = IDAdapter.next + 1 & 0x3ff;
  pthread_rwlock_unlock((pthread_rwlock_t *)&IDAdapter.rwlock);
  if (id == 0xffff) goto LAB_00104a7a;
  log_log(1,"/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c",
          0x172,"old_id=%d,new_id=%d",(ulong)header.id,uVar23 & 0xffffffff);
  len = 0x10;
  set_header_id(recv_buffer,id);
  sVar13 = sendto(query_sockfd,recv_buffer,(ulong)(uVar11 & 0x7fffffff),0,(sockaddr *)&query_server,
                  0x10);
  if (-1 < sVar13) goto LAB_00104a7a;
  piVar15 = __errno_location();
  pcVar16 = strerror(*piVar15);
  iVar10 = 0x177;
  pcVar26 = "sendto error";
LAB_0010511a:
  log_log(4,"/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c",
          iVar10,"%s:%s",pcVar26,pcVar16);
  *piVar15 = 0;
  goto LAB_00104a7a;
}

Assistant:

int main(int argc, char **argv) {

  //_sockaddr_in在不启用ipv6的情况下是sockaddr_in;
  //否则是struct sockaddr_in6
  _sockaddr_in cliaddr;

  socklen_t len, clilen;
  
  struct dns_header header;//暂存DNS header
  struct question question;//暂存DNS question
  struct answer ans[20];//暂存DNS answer
  struct record_data tmp_ans_data[10];
  struct record_data *data;//获取缓存的指针
  struct static_record_data *static_data;//获取本地缓存的指针
  // unsigned ip;
  
  int _size; //临时变量
  time_t now;

  fd_set rset;//读集合
  FD_ZERO(&rset);

  struct timeval timeout; //select函数中timeout参数
  timeout.tv_usec= SELECT_TTL; //设置timeout的值
  timeout.tv_sec=0;
  //初始化,处理命令行参数，初始化cache，初始化WSA和socket套接字,设置超时，绑定端口
  init(argc,argv);

  clilen = sizeof(cliaddr);
     

  int max_fd = query_sockfd + 1;
  // struct timeval timeout;
  while (1) {
    FD_SET(server_sockfd,&rset);
    FD_SET(query_sockfd,&rset);
    
    int work_fd;  
    if( (work_fd = select(max_fd,&rset,NULL,NULL,&timeout))<0){
      //!!!!加处理
      log_info("跳过");
      continue;
    }

    // //查找超时的项并处理
    if(work_fd==0){
      for(int i=0;i<IDAadpter_SIZE;i++){
        if(IDAdapter.data[i].valid&&(clock()-IDAdapter.data[i].start>=DNS_TTL)){
          IDtoAddr * idtoaddr = &IDAdapter.data[i].info;
          log_info("超时回复");
          set_header_flag(IDAdapter.data[i].message,FLAG_RESPONSE_NORMAL);
          set_header_rcode_refused(IDAdapter.data[i].message);
          if (sendto(server_sockfd, IDAdapter.data[i].message, strlen(IDAdapter.data[i].message), 0,(SA *)&idtoaddr->addr,
                    sizeof(idtoaddr->addr)) < 0) {
              log_error_shortcut("sendto error:");
          } else {
            log_info("发送成功");
          }
          IDAdapter.data[i].valid=false;
        }
      }
    }
    
    handle_relay://处理中继
    if (FD_ISSET(query_sockfd,&rset)){
      //优先处理未完成的请求
      log_info("处理DNS服务器发来请求");
      int total_size;
      int ans_num = 0;
      IDtoAddr * iptoaddr;
      if (( (total_size = recvfrom(query_sockfd , recv_buffer, MAX_DNS_SIZE, 0,(SA *)&query_server, &len))<0)){
          log_error_shortcut("recvfrom error:");
          goto handle_request;//跳过本次处理
      }
      read_dns_header(&header, recv_buffer);
      if( (iptoaddr = IDAdapter_get(header.id)) == NULL){
        log_error("invalid id");
        goto handle_request;//跳过本次处理
      }
      log_info("报文id=%d,旧id=%d type=%d",header.id,iptoaddr->old_id,iptoaddr->type);
      if(iptoaddr->type == RRTYPE_A||iptoaddr->type==RRTYPE_AAAA){
        //可以缓存的类型
        ans_num = read_dns_answers(ans, recv_buffer);
        // log_debug("ans_num: %d\n",ans_num);
        if (ans_num > 0) {
          int count =0;
          struct record_data* send_data[20];
          now = time(NULL);
          read_dns_question(&question,recv_buffer+12,recv_buffer);
          for(int i=0;i<ans_num;i++){
              // memcpy_s(&tmp_ans_data[count].ip,sizeof(struct IP),&ans[i].address,sizeof(struct IP)); 
              // puts(ans[0].name);
              memcpy(&tmp_ans_data[count].ip,&ans[i].address.addr,sizeof(struct IP));
              // printf("%04x:%04x:%04x\n",ans[i].address.addr.v6byte[0],ans[i].address.addr.v6byte[1],ans[i].address.addr.v6byte[2]);
              tmp_ans_data[count].label = question.label;
              tmp_ans_data[count].ttl = now + ans[i].ttl;
              send_data[count] = &tmp_ans_data[count];
              count++;
          }
          log_debug("count:%d",count);
          if(count>0){
            
            if(iptoaddr->type == RRTYPE_A){
              set_cache_A_multi_record(&cacheset.A.temp,question.label,(void**)send_data,count);
            }else if(iptoaddr->type == RRTYPE_AAAA){
              set_cache_A_multi_record(&cacheset.AAAA.temp,question.label,(void**)send_data,count);
            }
          }
        }
      }
      set_header_id(recv_buffer,iptoaddr->old_id);
      if ( (sendto(server_sockfd, recv_buffer, total_size, 0, (SA *)&(iptoaddr->addr),sizeof(iptoaddr->addr) )  ) < 0){
          log_error_shortcut("sendto error:");
      }
      log_ip("处理结束: ",&cliaddr);
      IDAdapter_pop(header.id);
      
    }

    handle_request:
    if (FD_ISSET(server_sockfd,&rset)){
      //如果有一个新的请求
      int rec;
      len = clilen;
      if ((rec = recvfrom(server_sockfd, recv_buffer, MAX_DNS_SIZE, 0, (SA *)&cliaddr, &len))<0){
      continue;
    }
      log_ip("recvfrom:",&cliaddr);

      read_dns_header(&header, recv_buffer);
      // sprint_dns(recv_buffer);
      if (header.flags != htons(FLAG_QUERY)) {
        //不是询问，也丢弃
        set_header_flag(recv_buffer,FLAG_RESPONSE_NORMAL);
        set_header_rcode_refused(recv_buffer);
        if (sendto(server_sockfd, recv_buffer, rec , 0,(SA *)&cliaddr,
                    sizeof(cliaddr)) < 0) {
          log_error_shortcut("sendto error:");
        } else {
          log_info("成功回复");
        }
      }
      read_dns_questions(&question, recv_buffer);
      log_info("%s %s",RRtype_to_str(question.qtype),question.label);
      data = NULL;
      static_data = NULL;
      if ( (static_data=get_static_cache(&cacheset.blacklist,question.label)) ){//不能少括号
        log_info("拦截请求");
        set_header_flag(recv_buffer,FLAG_RESPONSE_NORMAL);
        set_header_rcode_name_error(recv_buffer);
        if (sendto(server_sockfd, recv_buffer, rec , 0,(SA *)&cliaddr,
                  sizeof(cliaddr)) < 0) {
            log_error_shortcut("sendto error:");
        } else {
          log_info("发送成功");
        }
        continue;
      }
      if(question.qtype==RRTYPE_A){
        // puts(question.label);
        static_data = get_static_cache(&cacheset.A.local,question.label);
        // if(!static_data)puts("aaaaa");
        if(!static_data)data = get_cache_A_record(&cacheset.A.temp,question.label);
      }else if (question.qtype==RRTYPE_AAAA){
        static_data = get_static_cache(&cacheset.AAAA.local,question.label);
        if(!static_data)data = get_cache_A_record(&cacheset.AAAA.temp,question.label);
      }
      int count=0;
      if(static_data){
        //取到本地记录
        while(static_data){
          ans[count].ttl = 3600;//1小时
          memcpy(&ans[count].address, &static_data->ip, sizeof(struct IP));
          ans[count].type = question.qtype;
          ans[count].class_ = question.qclass;
          ans[count].has_cname = false;
          strcpy(ans[count].name,question.label);
          // strcpy_s(ans[count].name, sizeof(ans[0].name),question.label);
          count += 1;
          static_data = static_data->next;
        }
      }else if(data){
        //取到
        now = time(NULL);
        while(data){
          ans[count].ttl = data->ttl - now;
          memcpy(&ans[count].address, &data->ip, sizeof(struct IP));
          strcpy(ans[count].name,question.label);
          // strcpy_s(ans[count].name, sizeof(ans[0].name),question.label);
          ans[count].type = question.qtype;
          ans[count].class_ = question.qclass;
          ans[count].has_cname = false;
          // strcpy_s(ans[count].name, sizeof(ans[0].name),question.label);
          strcpy(ans[count].name, question.label);
          count++;
          data=data->next;
        }
      }
      if(count){
        //取到缓存   
        log_info("取到缓存");
        // printf("aaa\n%04x:%04x:%04x:%04x",
        // ans[0].address.addr.v6byte[0], ans[0].address.addr.v6byte[1], ans[0].address.addr.v6byte[2],ans[0].address.addr.v6byte[3]);
        _size = write_dns_response_by_query(recv_buffer, ans, count);
        // sprint_dns(query_buffer);
        if (sendto(server_sockfd, recv_buffer, _size, 0, (SA *)&cliaddr,
                  sizeof(cliaddr)) < 0) {
          log_error_shortcut("send error");
        } else {
          log_info("send data. size=%d ans数量=%d .成功回复",_size,count);
        }
      }else{
        //未取到缓存，需要查询
        log_info("未取到缓存");
        short new_id=0;
        *(recv_buffer+rec)='\0';
        if ( (new_id = IDAdapter_push(header.id,&cliaddr,question.qtype,clock(),recv_buffer)) !=-1){
            log_debug("old_id=%d,new_id=%d",header.id ,new_id);
            len = sizeof(struct sockaddr_in);
            set_header_id(recv_buffer,new_id);
            if (sendto(query_sockfd, (char *)recv_buffer, rec, 0, (SA *)&query_server,
                      ADDR_LEN)<0) {
              log_error_shortcut("sendto error");
            }
        }
      }
    }
    // err_handle:

  }
  return 0;
}